

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_psx_Socket.h
# Opt level: O0

size_t __thiscall axl::io::psx::Socket::sendTo(Socket *this,void *p,size_t size,sockaddr *addr)

{
  int iVar1;
  size_t sVar2;
  sockaddr *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  int *in_RDI;
  int result;
  
  iVar1 = *in_RDI;
  sVar2 = getSockAddrSize((sockaddr *)0x12edbb);
  sendto(iVar1,in_RSI,in_RDX,0,in_RCX,(socklen_t)sVar2);
  iVar1 = err::complete<int>(0,0x12edea);
  return (long)iVar1;
}

Assistant:

size_t
	sendTo(
		void* p,
		size_t size,
		const sockaddr* addr
	) {
		int result = ::sendto(m_h, p, size, 0, addr, getSockAddrSize(addr));
		return err::complete(result, -1);
	}